

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-async.c
# Opt level: O1

void worker_async_cb(uv_async_t *handle)

{
  int iVar1;
  uint uVar2;
  uv_async_t *handle_00;
  uv_loop_t *loop;
  uv_loop_t *handle_01;
  
  handle_00 = handle + -1;
  iVar1 = uv_async_send(handle_00);
  if (iVar1 == 0) {
    uVar2 = *(int *)((long)&handle[1].loop + 4) + 1;
    *(uint *)((long)&handle[1].loop + 4) = uVar2;
    handle[1].type = handle[1].type + UV_ASYNC;
    if (999999 < uVar2) {
      uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
      return;
    }
    return;
  }
  worker_async_cb_cold_1();
  loop = (uv_loop_t *)(handle_00 + 1);
  iVar1 = uv_async_send((uv_async_t *)loop);
  if (iVar1 == 0) {
    uVar2 = *(int *)((long)&handle_00[2].data + 4) + 1;
    *(uint *)((long)&handle_00[2].data + 4) = uVar2;
    *(int *)&handle_00[2].loop = *(int *)&handle_00[2].loop + 1;
    if (999999 < uVar2) {
      uv_close((uv_handle_t *)handle_00,(uv_close_cb)0x0);
      return;
    }
    return;
  }
  main_async_cb_cold_1();
  handle_01 = (uv_loop_t *)&loop[1].active_handles;
  iVar1 = uv_async_send((uv_async_t *)handle_01);
  if (iVar1 == 0) {
    handle_01 = loop;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      uv_loop_close(loop);
      return;
    }
  }
  else {
    worker_cold_1();
  }
  worker_cold_2();
  iVar1 = uv_is_closing((uv_handle_t *)handle_01);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)handle_01,(uv_close_cb)0x0);
  return;
}

Assistant:

static void worker_async_cb(uv_async_t* handle) {
  struct ctx* ctx = container_of(handle, struct ctx, worker_async);

  ASSERT(0 == uv_async_send(&ctx->main_async));
  ctx->worker_sent++;
  ctx->worker_seen++;

  if (ctx->worker_sent >= NUM_PINGS)
    uv_close((uv_handle_t*) &ctx->worker_async, NULL);
}